

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_CheckIfTargetInLOS
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  PClass *pPVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  uint uVar7;
  char *pcVar8;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar9;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 this;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar10;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar11;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  uint uVar16;
  double dVar17;
  double dVar18;
  FTranslatedLineTarget t;
  undefined1 local_68 [16];
  DAngle local_58;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 local_50 [4];
  PClass *pPVar6;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003d8a1a;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d8a0a:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d8a1a:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1095,
                  "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this.p == (AActor *)0x0) goto LAB_003d8452;
    pPVar6 = (this.o)->Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar5 = (**((this.p)->super_DThinker).super_DObject._vptr_DObject)(this.p);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
      (this.o)->Class = pPVar6;
    }
    bVar13 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar3 && bVar13) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar13 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar13) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d8a1a;
    }
  }
  else {
    if (this.p != (AActor *)0x0) goto LAB_003d8a0a;
LAB_003d8452:
    this.p = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d8aa8:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1096,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar14 = (undefined4)*(undefined8 *)&param[1].field_0;
    uVar15 = (undefined4)((ulong)*(undefined8 *)&param[1].field_0 >> 0x20);
LAB_003d84ac:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d8ac7:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1097,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar7 = param[2].field_0.i;
LAB_003d84bb:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d8a58:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1098,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar17 = param[3].field_0.f;
LAB_003d84cc:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d8a39:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1099,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d8aa8;
    }
    uVar14 = (undefined4)*(undefined8 *)&param[1].field_0;
    uVar15 = (undefined4)((ulong)*(undefined8 *)&param[1].field_0 >> 0x20);
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003d84ac;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d8ac7;
    }
    uVar7 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003d84bb;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d8a58;
    }
    dVar17 = param[3].field_0.f;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003d84cc;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d8a39;
    }
  }
  dVar1 = param[4].field_0.f;
  if (*(player_t **)((long)this + 0x230) == (player_t *)0x0) {
    if ((uVar7 & 0x40) == 0) {
      if (((uVar7 & 1) == 0 || (((this.p)->flags).Value & 0x10000) == 0) && ((uVar7 & 0x1000) == 0))
      {
        local_50[0] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                      ((anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(this.o + 0xd))->p;
        if (local_50[0].p != (AActor *)0x0) {
          if ((((local_50[0].p)->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
LAB_003d8629:
            if (((uVar7 & 0x20) == 0) || (0 < (local_50[0].p)->health)) goto LAB_003d86b9;
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x10b8,
                            "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            goto LAB_003d8986;
          }
          paVar10 = &((this.p)->target).field_0;
LAB_003d896f:
          paVar10->p = (AActor *)0x0;
        }
      }
      else if (((((this.p)->flags2).Value & 0x40000000) != 0 || (uVar7 & 0x1000) != 0) &&
              (local_50[0] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                             *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)
                              &this.o[0xf].ObjectFlags, local_50[0].p != (AActor *)0x0)) {
        if ((((local_50[0].p)->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)
        goto LAB_003d8629;
        paVar10 = &((this.p)->tracer).field_0;
        goto LAB_003d896f;
      }
    }
    else {
      local_50[0] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                    ((anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(this.o + 0x10))->p;
      if (local_50[0].p != (AActor *)0x0) {
        if ((((local_50[0].p)->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)
        goto LAB_003d8629;
        paVar10 = &((this.p)->master).field_0;
        goto LAB_003d896f;
      }
    }
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x10b4,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    goto LAB_003d8986;
  }
  local_68._8_8_ = ((this.p)->Angles).Yaw.Degrees;
  uVar16 = 0;
  if ((uVar7 >> 0xb & 1) != 0) {
    uVar16 = 0x3fe00000;
  }
  local_58.Degrees = (double)((ulong)uVar16 << 0x20);
  P_AimLineAttack((AActor *)local_68,(DAngle *)this.p,2048.0,(FTranslatedLineTarget *)(local_68 + 8)
                  ,(DAngle *)local_50,(int)&local_58,(AActor *)&DAT_00000020,(AActor *)0x0);
  if (local_50[0].p == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x10c4,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    goto LAB_003d8986;
  }
  aVar11 = local_50[0];
  switch(uVar7 >> 7 & 3) {
  case 0:
    uVar14 = 0;
    uVar15 = 0;
    bVar13 = false;
    break;
  case 1:
    goto LAB_003d86b9;
  case 2:
    bVar13 = false;
    break;
  case 3:
    uVar14 = 0;
    uVar15 = 0;
LAB_003d86b9:
    bVar13 = (uVar7 & 2) == 0;
    aVar11 = local_50[0];
  }
  if ((((uVar7 >> 10 & 1) == 0) || ((aVar11.p)->player != (player_t *)0x0)) ||
     ((((aVar11.p)->flags3).Value & 0x2000) != 0)) {
    dVar18 = (double)CONCAT44(uVar15,uVar14);
    if (((uVar7 >> 9 & 1) == 0) || (bVar4 = AActor::IsFriend(this.p,aVar11.p), !bVar4)) {
      dVar2 = AActor::Distance3D(this.p,aVar11.p,false);
      if (((dVar17 == 0.0) && (!NAN(dVar17))) || (dVar2 <= dVar17)) {
        aVar12 = aVar11;
        aVar9 = this;
        if (((dVar1 == 0.0) && (!NAN(dVar1))) || (dVar1 <= dVar2)) {
          if ((char)uVar7 < '\0') {
            aVar12 = this;
            aVar9 = aVar11;
          }
          if (bVar13) {
LAB_003d8852:
            bVar13 = P_CheckSight(aVar9.p,aVar12.p,1);
            if (!bVar13) {
              if (numret < 1) {
                return 0;
              }
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x10fd,
                              "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              goto LAB_003d8986;
            }
          }
        }
        else {
          if ((uVar7 & 0x10) != 0) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x10ef,
                            "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            goto LAB_003d8986;
          }
          if ((uVar7 & 4) != 0) {
            dVar18 = 0.0;
          }
          if ((char)uVar7 < '\0') {
            aVar12 = this;
            aVar9 = aVar11;
          }
          if ((bool)((uVar7 & 8) == 0 & bVar13)) goto LAB_003d8852;
        }
        if (360.0 <= dVar18) {
          dVar18 = 360.0;
        }
        if (0.0 < dVar18) {
          if (aVar9.p == this.p) {
            this = aVar12;
          }
          if ((uVar7 >> 8 & 1) == 0) {
            this = aVar9;
            aVar9 = aVar12;
          }
          AActor::AngleTo((AActor *)local_68,this.p,aVar9._0_1_);
          if (dVar18 * 0.5 <
              ABS((double)SUB84(((double)local_68._0_8_ - ((this.p)->Angles).Yaw.Degrees) *
                                11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08))
          {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x110e,
                            "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            goto LAB_003d8986;
          }
        }
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1111,
                        "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        uVar14 = 1;
        if (ret->RegType != '\0') goto LAB_003d8a79;
        goto LAB_003d8992;
      }
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x10e9,
                      "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x10e3,
                      "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
  }
  else {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x10de,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
LAB_003d8986:
  if (ret->RegType != '\0') {
LAB_003d8a79:
    __assert_fail("RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                  ,0x13f,"void VMReturn::SetInt(int)");
  }
  uVar14 = 0;
LAB_003d8992:
  *(undefined4 *)ret->Location = uVar14;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckIfTargetInLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF	(fov)		
	PARAM_INT_DEF	(flags)		
	PARAM_FLOAT_DEF	(dist_max)	
	PARAM_FLOAT_DEF	(dist_close)

	AActor *target, *viewport;
	FTranslatedLineTarget t;

	bool doCheckSight;

	if (!self->player)
	{
		if (flags & JLOSF_CHECKMASTER)
		{
			target = self->master;
		}
		else if ((self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE)) || (flags & JLOSF_CHECKTRACER))
		{
			if ((self->flags2 & MF2_SEEKERMISSILE) || (flags & JLOSF_CHECKTRACER))
				target = self->tracer;
			else
				target = NULL;
		}
		else
		{
			target = self->target;
		}

		if (target == NULL)
		{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
			ACTION_RETURN_BOOL(false);
		}
		if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
		{
			ACTION_RETURN_BOOL(false);
		}

		doCheckSight = !(flags & JLOSF_NOSIGHT);
	}
	else
	{
		// Does the player aim at something that can be shot?
		P_AimLineAttack(self, self->Angles.Yaw, MISSILERANGE, &t, (flags & JLOSF_NOAUTOAIM) ? 0.5 : 0., ALF_PORTALRESTRICT);
		
		if (!t.linetarget)
		{
			ACTION_RETURN_BOOL(false);
		}
		target = t.linetarget;

		switch (flags & (JLOSF_TARGETLOS|JLOSF_FLIPFOV))
		{
		case JLOSF_TARGETLOS|JLOSF_FLIPFOV:
			// target makes sight check, player makes fov check; player has verified fov
			fov = 0.;
			// fall-through
		case JLOSF_TARGETLOS:
			doCheckSight = !(flags & JLOSF_NOSIGHT); // The target is responsible for sight check and fov
			break;
		default:
			// player has verified sight and fov
			fov = 0.;
			// fall-through
		case JLOSF_FLIPFOV: // Player has verified sight, but target must verify fov
			doCheckSight = false;
			break;
		}
	}

	// [FDARI] If target is not a combatant, don't jump
	if ( (flags & JLOSF_COMBATANTONLY) && (!target->player) && !(target->flags3 & MF3_ISMONSTER))
	{
		ACTION_RETURN_BOOL(false);
	}
	// [FDARI] If actors share team, don't jump
	if ((flags & JLOSF_ALLYNOJUMP) && self->IsFriend(target))
	{
		ACTION_RETURN_BOOL(false);
	}
	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_BOOL(false);
	}
	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_BOOL(false);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (flags & JLOSF_TARGETLOS) { viewport = target; target = self; }
	else { viewport = self; }

	if (doCheckSight && !P_CheckSight (viewport, target, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_BOOL(false);
	}

	if (flags & JLOSF_FLIPFOV)
	{
		if (viewport == self) { viewport = target; target = self; }
		else { target = viewport; viewport = self; }
	}

	fov = MIN<DAngle>(fov, 360.);

	if (fov > 0)
	{
		DAngle an = absangle(viewport->AngleTo(target), viewport->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_BOOL(false); // [KS] Outside of FOV - return
		}
	}
	ACTION_RETURN_BOOL(true);
}